

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USS.h
# Opt level: O0

void __thiscall USS<4U>::USS(USS<4U> *this,uint32_t _SIZE)

{
  void *pvVar1;
  undefined8 *in_RDI;
  StreamSummary<4U> *unaff_retaddr;
  Abstract<4U> *in_stack_ffffffffffffffd0;
  undefined8 *puVar2;
  uint32_t _SIZE_00;
  
  puVar2 = in_RDI;
  Abstract<4U>::Abstract(in_stack_ffffffffffffffd0);
  _SIZE_00 = (uint32_t)((ulong)puVar2 >> 0x20);
  *in_RDI = &PTR_Init_00124c38;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"USS");
  pvVar1 = operator_new(0x48);
  StreamSummary<4U>::StreamSummary(unaff_retaddr,_SIZE_00);
  in_RDI[0xe] = pvVar1;
  return;
}

Assistant:

USS(uint32_t _SIZE) {
		this->name = "USS";
		summary = new StreamSummary<DATA_LEN>(_SIZE);
	}